

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_parsed_expression.cpp
# Opt level: O3

unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> __thiscall
duckdb::CaseExpression::Deserialize(CaseExpression *this,Deserializer *deserializer)

{
  uint uVar1;
  int iVar2;
  CaseExpression *this_00;
  pointer pCVar3;
  byte bVar4;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> _Var5;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> _Var6;
  _Head_base<0UL,_duckdb::CaseExpression_*,_false> local_70;
  undefined1 local_68 [16];
  _Alloc_hider local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  optional_idx local_38;
  
  this_00 = (CaseExpression *)operator_new(0x58);
  CaseExpression(this_00);
  local_70._M_head_impl = this_00;
  pCVar3 = unique_ptr<duckdb::CaseExpression,_std::default_delete<duckdb::CaseExpression>,_true>::
           operator->((unique_ptr<duckdb::CaseExpression,_std::default_delete<duckdb::CaseExpression>,_true>
                       *)&local_70);
  uVar1 = (*deserializer->_vptr_Deserializer[4])(deserializer,200,"case_checks");
  if ((char)uVar1 == '\0') {
    local_58._M_p =
         (pointer)(pCVar3->case_checks).
                  super_vector<duckdb::CaseCheck,_std::allocator<duckdb::CaseCheck>_>.
                  super__Vector_base<duckdb::CaseCheck,_std::allocator<duckdb::CaseCheck>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage;
    local_68._0_8_ =
         (pCVar3->case_checks).super_vector<duckdb::CaseCheck,_std::allocator<duckdb::CaseCheck>_>.
         super__Vector_base<duckdb::CaseCheck,_std::allocator<duckdb::CaseCheck>_>._M_impl.
         super__Vector_impl_data._M_start;
    local_68._8_8_ =
         (pCVar3->case_checks).super_vector<duckdb::CaseCheck,_std::allocator<duckdb::CaseCheck>_>.
         super__Vector_base<duckdb::CaseCheck,_std::allocator<duckdb::CaseCheck>_>._M_impl.
         super__Vector_impl_data._M_finish;
    (pCVar3->case_checks).super_vector<duckdb::CaseCheck,_std::allocator<duckdb::CaseCheck>_>.
    super__Vector_base<duckdb::CaseCheck,_std::allocator<duckdb::CaseCheck>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (pCVar3->case_checks).super_vector<duckdb::CaseCheck,_std::allocator<duckdb::CaseCheck>_>.
    super__Vector_base<duckdb::CaseCheck,_std::allocator<duckdb::CaseCheck>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (pCVar3->case_checks).super_vector<duckdb::CaseCheck,_std::allocator<duckdb::CaseCheck>_>.
    super__Vector_base<duckdb::CaseCheck,_std::allocator<duckdb::CaseCheck>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_48._M_allocated_capacity = 0;
    local_48._8_8_ = 0;
    local_38.index = 0;
    ::std::vector<duckdb::CaseCheck,_std::allocator<duckdb::CaseCheck>_>::~vector
              ((vector<duckdb::CaseCheck,_std::allocator<duckdb::CaseCheck>_> *)local_68);
  }
  else {
    Deserializer::Read<duckdb::vector<duckdb::CaseCheck,true>>((type *)&local_48,deserializer);
    local_58._M_p =
         (pointer)(pCVar3->case_checks).
                  super_vector<duckdb::CaseCheck,_std::allocator<duckdb::CaseCheck>_>.
                  super__Vector_base<duckdb::CaseCheck,_std::allocator<duckdb::CaseCheck>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage;
    (pCVar3->case_checks).super_vector<duckdb::CaseCheck,_std::allocator<duckdb::CaseCheck>_>.
    super__Vector_base<duckdb::CaseCheck,_std::allocator<duckdb::CaseCheck>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)local_38.index;
    local_68._0_8_ =
         (pCVar3->case_checks).super_vector<duckdb::CaseCheck,_std::allocator<duckdb::CaseCheck>_>.
         super__Vector_base<duckdb::CaseCheck,_std::allocator<duckdb::CaseCheck>_>._M_impl.
         super__Vector_impl_data._M_start;
    local_68._8_8_ =
         (pCVar3->case_checks).super_vector<duckdb::CaseCheck,_std::allocator<duckdb::CaseCheck>_>.
         super__Vector_base<duckdb::CaseCheck,_std::allocator<duckdb::CaseCheck>_>._M_impl.
         super__Vector_impl_data._M_finish;
    (pCVar3->case_checks).super_vector<duckdb::CaseCheck,_std::allocator<duckdb::CaseCheck>_>.
    super__Vector_base<duckdb::CaseCheck,_std::allocator<duckdb::CaseCheck>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)local_48._M_allocated_capacity;
    (pCVar3->case_checks).super_vector<duckdb::CaseCheck,_std::allocator<duckdb::CaseCheck>_>.
    super__Vector_base<duckdb::CaseCheck,_std::allocator<duckdb::CaseCheck>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)local_48._8_8_;
    local_48._M_allocated_capacity = 0;
    local_48._8_8_ = 0;
    local_38.index = 0;
    ::std::vector<duckdb::CaseCheck,_std::allocator<duckdb::CaseCheck>_>::~vector
              ((vector<duckdb::CaseCheck,_std::allocator<duckdb::CaseCheck>_> *)local_68);
  }
  ::std::vector<duckdb::CaseCheck,_std::allocator<duckdb::CaseCheck>_>::~vector
            ((vector<duckdb::CaseCheck,_std::allocator<duckdb::CaseCheck>_> *)&local_48);
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)(uVar1 & 0xff));
  pCVar3 = unique_ptr<duckdb::CaseExpression,_std::default_delete<duckdb::CaseExpression>,_true>::
           operator->((unique_ptr<duckdb::CaseExpression,_std::default_delete<duckdb::CaseExpression>,_true>
                       *)&local_70);
  iVar2 = (*deserializer->_vptr_Deserializer[4])(deserializer,0xc9,"else_expr");
  bVar4 = (byte)iVar2;
  if (bVar4 == 0) {
    _Var5._M_head_impl =
         (pCVar3->else_expr).
         super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
         _M_t.
         super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
         .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
    (pCVar3->else_expr).
    super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>._M_t.
    super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
    .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl = (ParsedExpression *)0x0
    ;
    if (_Var5._M_head_impl == (ParsedExpression *)0x0) {
      bVar4 = 0;
      goto LAB_0174fdba;
    }
  }
  else {
    iVar2 = (*deserializer->_vptr_Deserializer[10])(deserializer);
    if ((char)iVar2 == '\0') {
      _Var6._M_head_impl = (ParsedExpression *)0x0;
    }
    else {
      (*deserializer->_vptr_Deserializer[6])(deserializer);
      ParsedExpression::Deserialize((ParsedExpression *)local_68,deserializer);
      _Var6._M_head_impl = (ParsedExpression *)local_68._0_8_;
      (*deserializer->_vptr_Deserializer[7])(deserializer);
    }
    (*deserializer->_vptr_Deserializer[0xb])(deserializer);
    _Var5._M_head_impl =
         (pCVar3->else_expr).
         super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
         _M_t.
         super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
         .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
    (pCVar3->else_expr).
    super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>._M_t.
    super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
    .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl = _Var6._M_head_impl;
    if (_Var5._M_head_impl == (ParsedExpression *)0x0) {
      bVar4 = 1;
      goto LAB_0174fdba;
    }
  }
  (*((_Var5._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
LAB_0174fdba:
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)bVar4);
  (this->super_ParsedExpression).super_BaseExpression._vptr_BaseExpression =
       (_func_int **)local_70._M_head_impl;
  return (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
         (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)this;
}

Assistant:

unique_ptr<ParsedExpression> CaseExpression::Deserialize(Deserializer &deserializer) {
	auto result = duckdb::unique_ptr<CaseExpression>(new CaseExpression());
	deserializer.ReadPropertyWithDefault<vector<CaseCheck>>(200, "case_checks", result->case_checks);
	deserializer.ReadPropertyWithDefault<unique_ptr<ParsedExpression>>(201, "else_expr", result->else_expr);
	return std::move(result);
}